

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_BackUpOnDestruction_DD_BackUpOnDestruction_Test
::~TokenizerTest_BackUpOnDestruction_DD_BackUpOnDestruction_Test
          (TokenizerTest_BackUpOnDestruction_DD_BackUpOnDestruction_Test *this)

{
  TokenizerTest_BackUpOnDestruction_DD_BackUpOnDestruction_Test *this_local;
  
  ~TokenizerTest_BackUpOnDestruction_DD_BackUpOnDestruction_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_1D(TokenizerTest, BackUpOnDestruction, kBlockSizes) {
  std::string text = "foo bar";
  TestInputStream input(text.data(), text.size(), kBlockSizes_case);

  // Create a tokenizer, read one token, then destroy it.
  {
    TestErrorCollector error_collector;
    Tokenizer tokenizer(&input, &error_collector);

    tokenizer.Next();
  }

  // Only "foo" should have been read.
  EXPECT_EQ(strlen("foo"), input.ByteCount());
}